

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

void __thiscall google::protobuf::io::CordOutputStream::BackUp(CordOutputStream *this,int count)

{
  byte bVar1;
  CordRepFlat *pCVar2;
  sbyte sVar3;
  uint uVar4;
  ulong uVar5;
  char cVar6;
  sbyte sVar7;
  int iVar8;
  size_t sVar9;
  int iVar10;
  
  if (-1 < count) {
    uVar5 = (ulong)(this->cord_).contents_.data_.rep_.field_0.data[0];
    if ((uVar5 & 1) == 0) {
      uVar5 = uVar5 >> 1;
    }
    else {
      uVar5 = ((this->cord_).contents_.data_.rep_.field_0.as_tree.rep)->length;
    }
    bVar1 = (this->buffer_).rep_.field_0.short_rep.raw_size;
    cVar6 = (char)bVar1 >> 1;
    if ((bVar1 & 1) == 0) {
      sVar9 = (((this->buffer_).rep_.field_0.long_rep.rep)->super_CordRep).length;
    }
    else {
      sVar9 = (size_t)cVar6;
    }
    if ((long)(ulong)(uint)count <= (long)(sVar9 + uVar5)) {
      if (count == 0) {
        return;
      }
      if ((bVar1 & 1) == 0) {
        pCVar2 = (this->buffer_).rep_.field_0.long_rep.rep;
        iVar10 = (int)(pCVar2->super_CordRep).length;
        uVar4 = iVar10 - count;
        if (iVar10 < count) {
LAB_002b64ce:
          __assert_fail("count <= buffer_length",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                        ,0x28e,"virtual void google::protobuf::io::CordOutputStream::BackUp(int)");
        }
        bVar1 = (pCVar2->super_CordRep).tag;
        sVar7 = 0xc;
        if (bVar1 < 0xbb) {
          sVar7 = 6;
        }
        iVar10 = -0xb800d;
        if (bVar1 < 0xbb) {
          iVar10 = -0xe8d;
        }
        sVar3 = 3;
        if (0x42 < bVar1) {
          sVar3 = sVar7;
        }
        iVar8 = -0x1d;
        if (0x42 < bVar1) {
          iVar8 = iVar10;
        }
        if (uVar4 <= ((uint)bVar1 << sVar3) + iVar8) {
          (pCVar2->super_CordRep).length = (long)(int)uVar4;
LAB_002b64a1:
          this->state_ = kPartial;
          return;
        }
      }
      else {
        uVar4 = cVar6 - count;
        if (cVar6 < count) goto LAB_002b64ce;
        if (uVar4 < 0x10) {
          (this->buffer_).rep_.field_0.short_rep.raw_size = (char)uVar4 * '\x02' + '\x01';
          goto LAB_002b64a1;
        }
      }
      BackUp();
    }
  }
  __assert_fail("0 <= count && count <= ByteCount()",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                ,0x289,"virtual void google::protobuf::io::CordOutputStream::BackUp(int)");
}

Assistant:

void CordOutputStream::BackUp(int count) {
  // Check if something to do, else state remains unchanged.
  assert(0 <= count && count <= ByteCount());
  if (count == 0) return;

  // Backup() is not supposed to backup beyond last Next() call
  const int buffer_length = static_cast<int>(buffer_.length());
  assert(count <= buffer_length);
  if (count <= buffer_length) {
    buffer_.SetLength(static_cast<size_t>(buffer_length - count));
    state_ = State::kPartial;
  } else {
    buffer_ = {};
    cord_.RemoveSuffix(static_cast<size_t>(count));
    state_ = State::kSteal;
  }
}